

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fisheye.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  int iVar2;
  size_type sVar3;
  GLFWwindow *handle;
  EVP_PKEY_CTX *ctx;
  bool bVar4;
  exception *e;
  GLFWwindow *window;
  int i;
  char **argv_local;
  int argc_local;
  
  for (window._4_4_ = 1; window._4_4_ < argc; window._4_4_ = window._4_4_ + 1) {
    iVar1 = strcmp("--envmap",argv[window._4_4_]);
    if (iVar1 == 0) {
      std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&g_ibl.files,0);
      do {
        iVar1 = window._4_4_ + 1;
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (&g_ibl.files,argv + iVar1);
        bVar4 = false;
        if (window._4_4_ + 2 < argc) {
          iVar2 = strncmp("-",argv[window._4_4_ + 2],1);
          bVar4 = iVar2 != 0;
        }
        __stream = _stdout;
        window._4_4_ = iVar1;
      } while (bVar4);
      sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(&g_ibl.files);
      fprintf(__stream,"Note: number of Envmaps set to %i\n",sVar3 & 0xffffffff);
      fflush(_stdout);
    }
    else {
      iVar1 = strcmp("--shader-dir",argv[window._4_4_]);
      if (iVar1 == 0) {
        window._4_4_ = window._4_4_ + 1;
        g_app.dir.shader = argv[window._4_4_];
        fprintf(_stdout,"Note: shader dir set to %s\n",g_app.dir.shader);
        fflush(_stdout);
      }
    }
  }
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22007,1);
  fprintf(_stdout,"Loading {Window-Main}\n");
  fflush(_stdout);
  handle = glfwCreateWindow(0x690,0x41a,"Hello MERL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    glfwTerminate();
    argv_local._4_4_ = -1;
  }
  else {
    glfwMakeContextCurrent(handle);
    glfwSetKeyCallback(handle,keyboardCallback);
    glfwSetCursorPosCallback(handle,mouseMotionCallback);
    glfwSetMouseButtonCallback(handle,mouseButtonCallback);
    glfwSetScrollCallback(handle,mouseScrollCallback);
    fprintf(_stdout,"Loading {OpenGL}\n");
    fflush(_stdout);
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar1 == 0) {
      fprintf(_stdout,"gladLoadGLLoader failed\n");
      fflush(_stdout);
      argv_local._4_4_ = -1;
    }
    else {
      fprintf(_stdout,"-- Begin -- Demo\n");
      fflush(_stdout);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui_ImplGlfwGL3_Init(handle,false,(char *)0x0);
      ctx = (EVP_PKEY_CTX *)0x0;
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      init(ctx);
      while (iVar1 = glfwWindowShouldClose(handle), iVar1 == 0) {
        glfwPollEvents();
        (*glad_glClearColor)(0.8,0.8,0.8,1.0);
        (*glad_glClear)(0x4000);
        render();
        glfwSwapBuffers(handle);
      }
      release();
      ImGui_ImplGlfwGL3_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      glfwTerminate();
      fprintf(_stdout,"-- End -- Demo\n");
      fflush(_stdout);
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char **argv)
{
    for (int i = 1; i < argc; ++i) {
        if (!strcmp("--envmap", argv[i])) {
            g_ibl.files.resize(0);
            do {
                g_ibl.files.push_back(argv[++i]);
            } while ((i+1 < argc) && strncmp("-", argv[i+1], 1));
            LOG("Note: number of Envmaps set to %i\n", (int)g_ibl.files.size());
        } else if (!strcmp("--shader-dir", argv[i])) {
            g_app.dir.shader = argv[++i];
            LOG("Note: shader dir set to %s\n", g_app.dir.shader);
        }
    }

    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    // Create the Window
    LOG("Loading {Window-Main}\n");
    GLFWwindow* window = glfwCreateWindow(
                             VIEWER_DEFAULT_WIDTH,
                             VIEWER_DEFAULT_HEIGHT,
                             "Hello MERL", NULL, NULL
                             );
    if (window == NULL) {
        LOG("=> Failure <=\n");
        glfwTerminate();
        return -1;
    }
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, &keyboardCallback);
    glfwSetCursorPosCallback(window, &mouseMotionCallback);
    glfwSetMouseButtonCallback(window, &mouseButtonCallback);
    glfwSetScrollCallback(window, &mouseScrollCallback);

    // Load OpenGL functions
    LOG("Loading {OpenGL}\n");
    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        LOG("gladLoadGLLoader failed\n");
        return -1;
    }

    LOG("-- Begin -- Demo\n");
    try {
        //log_debug_output();
        ImGui::CreateContext();
        ImGui_ImplGlfwGL3_Init(window, false);
        ImGui::StyleColorsDark();
        init();

        while (!glfwWindowShouldClose(window)) {
            glfwPollEvents();

            glClearColor(0.8, 0.8, 0.8, 1.0);
            glClear(GL_COLOR_BUFFER_BIT);

            render();

            glfwSwapBuffers(window);
        }

        release();
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
    } catch (std::exception& e) {
        LOG("%s", e.what());
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    } catch (...) {
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    LOG("-- End -- Demo\n");


    return 0;
}